

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

bool __thiscall senjo::TestCommandHandle::Parse(TestCommandHandle *this,char *params)

{
  int iVar1;
  char *pcVar2;
  Output *pOVar3;
  ulong uVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  Output local_50;
  Output local_48;
  bool local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  bool invalid;
  allocator local_21;
  char *local_20;
  char *params_local;
  TestCommandHandle *this_local;
  
  local_20 = params;
  params_local = (char *)this;
  if ((Parse(char_const*)::argCount_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argCount_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argCount_abi_cxx11_,"count",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argCount_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argCount_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argDepth_abi_cxx11_,"depth",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argDepth_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argFile_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argFile_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argFile_abi_cxx11_,"file",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argFile_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&Parse(char_const*)::argFile_abi_cxx11_);
  }
  if ((Parse(char_const*)::argGain_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argGain_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argGain_abi_cxx11_,"gain",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argGain_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&Parse(char_const*)::argGain_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNoClear_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argNoClear_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argNoClear_abi_cxx11_,"noclear",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argNoClear_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNoClear_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPrint_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argPrint_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argPrint_abi_cxx11_,"print",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argPrint_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argPrint_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSkip_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argSkip_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argSkip_abi_cxx11_,"skip",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argSkip_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&Parse(char_const*)::argSkip_abi_cxx11_);
  }
  if ((Parse(char_const*)::argTime_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argTime_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argTime_abi_cxx11_,"time",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argTime_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&Parse(char_const*)::argTime_abi_cxx11_);
  }
  this->noClear = false;
  this->printBoard = false;
  this->maxCount = 0;
  this->maxDepth = 0;
  this->minGain = 0;
  this->skipCount = 0;
  this->maxTime = 0;
  std::__cxx11::string::operator=((string *)&this->fileName,"");
  local_3c = false;
  while( true ) {
    bVar5 = false;
    if (((local_3c & 1U) == 0) && (bVar5 = false, local_20 != (char *)0x0)) {
      pcVar2 = NextWord(&local_20);
      bVar5 = *pcVar2 != '\0';
    }
    if (!bVar5) break;
    bVar5 = HasParam((string *)Parse(char_const*)::argNoClear_abi_cxx11_,&this->noClear,&local_20);
    if (((((!bVar5) &&
          (bVar5 = HasParam((string *)Parse(char_const*)::argPrint_abi_cxx11_,&this->printBoard,
                            &local_20), !bVar5)) &&
         (bVar5 = NumberParam<int>((string *)Parse(char_const*)::argCount_abi_cxx11_,&this->maxCount
                                   ,&local_20,&local_3c), !bVar5)) &&
        ((bVar5 = NumberParam<int>((string *)Parse(char_const*)::argDepth_abi_cxx11_,&this->maxDepth
                                   ,&local_20,&local_3c), !bVar5 &&
         (bVar5 = NumberParam<int>((string *)Parse(char_const*)::argGain_abi_cxx11_,&this->minGain,
                                   &local_20,&local_3c), !bVar5)))) &&
       ((bVar5 = NumberParam<int>((string *)Parse(char_const*)::argSkip_abi_cxx11_,&this->skipCount,
                                  &local_20,&local_3c), !bVar5 &&
        ((bVar5 = NumberParam<unsigned_long>
                            ((string *)Parse(char_const*)::argTime_abi_cxx11_,&this->maxTime,
                             &local_20,&local_3c), !bVar5 &&
         (bVar5 = StringParam((string *)Parse(char_const*)::argFile_abi_cxx11_,&this->fileName,
                              &local_20,&local_3c), !bVar5)))))) {
      Output::Output(&local_48,InfoPrefix);
      pOVar3 = Output::operator<<(&local_48,(char (*) [19])"Unexpected token: ");
      Output::operator<<(pOVar3,&local_20);
      Output::~Output(&local_48);
      return false;
    }
  }
  if ((local_3c & 1U) != 0) {
    Output::Output(&local_50,InfoPrefix);
    pOVar3 = Output::operator<<(&local_50,(char (*) [8])"usage: ");
    (*(this->super_BackgroundCommand)._vptr_BackgroundCommand[3])(local_70);
    Output::operator<<(pOVar3,local_70);
    std::__cxx11::string::~string((string *)local_70);
    Output::~Output(&local_50);
    return false;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&this->fileName,(string *)_TEST_FILE_abi_cxx11_);
  }
  return true;
}

Assistant:

bool TestCommandHandle::Parse(const char* params)
{
  static const std::string argCount   = "count";
  static const std::string argDepth   = "depth";
  static const std::string argFile    = "file";
  static const std::string argGain    = "gain";
  static const std::string argNoClear = "noclear";
  static const std::string argPrint   = "print";
  static const std::string argSkip    = "skip";
  static const std::string argTime    = "time";

  noClear    = false;
  printBoard = false;
  maxCount   = 0;
  maxDepth   = 0;
  minGain    = 0;
  skipCount  = 0;
  maxTime    = 0;
  fileName   = "";

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (HasParam(argNoClear,  noClear,    params) ||
        HasParam(argPrint,    printBoard, params) ||
        NumberParam(argCount, maxCount,   params, invalid) ||
        NumberParam(argDepth, maxDepth,   params, invalid) ||
        NumberParam(argGain,  minGain,    params, invalid) ||
        NumberParam(argSkip,  skipCount,  params, invalid) ||
        NumberParam(argTime,  maxTime,    params, invalid) ||
        StringParam(argFile,  fileName,   params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (fileName.empty()) {
    fileName = _TEST_FILE;
  }

  return true;
}